

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

bool __thiscall QByteArray::isUpper(QByteArray *this)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  
  pcVar4 = (this->d).ptr;
  uVar2 = (this->d).size;
  pcVar1 = pcVar4 + uVar2;
  if (3 < uVar2) {
    lVar5 = (uVar2 >> 2) + 1;
    pcVar4 = pcVar4 + 3;
    do {
      pcVar3 = pcVar4;
      if ((byte)(pcVar3[-3] + 0x9fU) < 0x1a) {
        pcVar3 = pcVar3 + -3;
        goto LAB_003086ce;
      }
      if ((byte)(pcVar3[-2] + 0x9fU) < 0x1a) {
        pcVar3 = pcVar3 + -2;
        goto LAB_003086ce;
      }
      if ((byte)(pcVar3[-1] + 0x9fU) < 0x1a) {
        pcVar3 = pcVar3 + -1;
        goto LAB_003086ce;
      }
      if ((byte)(*pcVar3 + 0x9fU) < 0x1a) goto LAB_003086ce;
      lVar5 = lVar5 + -1;
      pcVar4 = pcVar3 + 4;
    } while (1 < lVar5);
    pcVar4 = pcVar3 + 1;
  }
  lVar5 = (long)pcVar1 - (long)pcVar4;
  if (lVar5 != 1) {
    pcVar3 = pcVar4;
    if (lVar5 != 2) {
      pcVar3 = pcVar1;
      if ((lVar5 != 3) || (pcVar3 = pcVar4, (byte)(*pcVar4 + 0x9fU) < 0x1a)) goto LAB_003086ce;
      pcVar3 = pcVar4 + 1;
    }
    if ((byte)(*pcVar3 + 0x9fU) < 0x1a) goto LAB_003086ce;
    pcVar4 = pcVar3 + 1;
  }
  pcVar3 = pcVar4;
  if (0x19 < (byte)(*pcVar4 + 0x9fU)) {
    pcVar3 = pcVar1;
  }
LAB_003086ce:
  return pcVar3 == pcVar1;
}

Assistant:

const T *data() const noexcept { return ptr; }